

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

wstring * PDA::Transducer::Generator::call(wstring *__return_storage_ptr__,wstring *label)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)__return_storage_ptr__,L"call\t",L"");
  std::__cxx11::wstring::_M_append
            ((wchar_t *)__return_storage_ptr__,(ulong)(label->_M_dataplus)._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::wstring Generator::call(const std::wstring &label)
{
    std::wstring result = L"call\t";
    result += label;
    return result;
}